

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astLambdaNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_functionDefinition_t *functionDefinition;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  uint64_t value;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  anon_struct_80_10_5e638c75 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  anon_struct_80_10_5e638c75 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_30 = &gcFrame;
  gcFrame.name = 0;
  gcFrame.captureList = 0;
  gcFrame.capturelessLiteral = 0;
  gcFrame.localBinding = 0;
  gcFrame.functionDefinition = (sysbvm_functionDefinition_t *)0x0;
  gcFrame.capturelessFunction = 0;
  gcFrame.argumentNode = 0;
  gcFrame.argumentCount = 0;
  gcFrame.lambdaNode = (sysbvm_astLambdaNode_t *)0x0;
  gcFrame.analyzedNameExpression = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 10;
  sysbvm_stackFrame_pushRecord(&local_48);
  gcFrame.lambdaNode = (sysbvm_astLambdaNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  ((gcFrame.lambdaNode)->super).analyzerToken = sVar3;
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = ((gcFrame.lambdaNode)->super).sourcePosition;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  if ((gcFrame.lambdaNode)->name != 0) {
    gcFrame.analyzedNameExpression =
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                   (context,(gcFrame.lambdaNode)->name,(context->roots).symbolType,arguments[1]);
    (gcFrame.lambdaNode)->name = gcFrame.analyzedNameExpression;
    _Var2 = sysbvm_astNode_isLiteralNode(context,gcFrame.analyzedNameExpression);
    if (!_Var2) {
      sysbvm_error("Local lambda analyzed name must be a literal node.");
    }
    gcFrame.name = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);
  }
  uVar1 = (gcFrame.lambdaNode)->arguments;
  bVar8 = (uVar1 & 0xf) != 0;
  if (bVar8 || uVar1 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  value = 0;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    if (bVar8 || uVar1 == 0) {
      gcFrame.argumentNode = 0;
    }
    else {
      gcFrame.argumentNode = *(ulong *)(uVar1 + 0x10 + uVar5 * 8);
    }
    uVar6 = 1;
    if ((gcFrame.argumentNode & 0xf) == 0 && gcFrame.argumentNode != 0) {
      uVar6 = (ulong)(*(long *)(gcFrame.argumentNode + 0x28) != 0x1f);
    }
    value = value + uVar6;
  }
  gcFrame.argumentCount = sysbvm_tuple_uint64_encode(context,value);
  gcFrame.functionDefinition =
       (sysbvm_functionDefinition_t *)
       sysbvm_functionDefinition_create
                 (context,((gcFrame.lambdaNode)->super).sourcePosition,(gcFrame.lambdaNode)->flags,
                  (gcFrame.lambdaNode)->callingConventionName,gcFrame.argumentCount,arguments[1],
                  (gcFrame.lambdaNode)->arguments,(gcFrame.lambdaNode)->resultType,
                  (gcFrame.lambdaNode)->body);
  (gcFrame.lambdaNode)->functionDefinition = (sysbvm_tuple_t)gcFrame.functionDefinition;
  sysbvm_analysisEnvironment_addInnerFunction
            (context,arguments[1],(sysbvm_tuple_t)gcFrame.functionDefinition);
  sysbvm_functionDefinition_ensureAnalysis(context,&gcFrame.functionDefinition);
  ((gcFrame.lambdaNode)->super).analyzedType = (gcFrame.functionDefinition)->type;
  sVar3 = (gcFrame.functionDefinition)->bytecode;
  if (sVar3 == 0) {
    sVar3 = (gcFrame.functionDefinition)->sourceAnalyzedDefinition;
    lVar7 = 0x20;
    if (sVar3 == 0) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:1358: assertion failure: gcFrame.functionDefinition->sourceAnalyzedDefinition"
                );
      sVar3 = (gcFrame.functionDefinition)->sourceAnalyzedDefinition;
    }
  }
  else {
    lVar7 = 0x48;
  }
  functionDefinition = gcFrame.functionDefinition;
  gcFrame.captureList = *(ulong *)(sVar3 + lVar7);
  if (((gcFrame.captureList & 0xf) == 0 && gcFrame.captureList != 0) &&
     (7 < *(uint *)(gcFrame.captureList + 0xc))) {
    if (gcFrame.name != 0) {
      gcFrame.localBinding =
           sysbvm_analysisEnvironment_setNewSymbolLocalBinding
                     (context,arguments[1],((gcFrame.lambdaNode)->super).sourcePosition,gcFrame.name
                      ,((gcFrame.lambdaNode)->super).analyzedType);
      (gcFrame.lambdaNode)->binding = gcFrame.localBinding;
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
    sysbvm_stackFrame_popRecord(&local_48);
    gcFrame.capturelessLiteral = (sysbvm_tuple_t)gcFrame.lambdaNode;
  }
  else {
    sVar3 = sysbvm_sequenceTuple_create(context,(gcFrame.functionDefinition)->captureVectorType);
    gcFrame.capturelessFunction =
         sysbvm_function_createClosureWithCaptureVector
                   (context,(sysbvm_tuple_t)functionDefinition,sVar3);
    gcFrame.capturelessLiteral =
         sysbvm_astLiteralNode_create
                   (context,((gcFrame.lambdaNode)->super).sourcePosition,gcFrame.capturelessFunction
                   );
    if (gcFrame.name != 0) {
      gcFrame.localBinding =
           sysbvm_analysisEnvironment_setNewValueBinding
                     (context,arguments[1],((gcFrame.lambdaNode)->super).sourcePosition,gcFrame.name
                      ,gcFrame.capturelessFunction);
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
    sysbvm_stackFrame_popRecord(&local_48);
  }
  return gcFrame.capturelessLiteral;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLambdaNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astLambdaNode_t *lambdaNode;
        sysbvm_tuple_t analyzedNameExpression;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argumentCount;
        sysbvm_functionDefinition_t *functionDefinition;
        sysbvm_tuple_t capturelessFunction;
        sysbvm_tuple_t capturelessLiteral;
        sysbvm_tuple_t localBinding;
        sysbvm_tuple_t name;
        sysbvm_tuple_t captureList;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.lambdaNode = (sysbvm_astLambdaNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.lambdaNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.lambdaNode->super.sourcePosition);

    if(gcFrame.lambdaNode->name)
    {
        gcFrame.analyzedNameExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.lambdaNode->name, context->roots.symbolType, *environment);
        gcFrame.lambdaNode->name = gcFrame.analyzedNameExpression;
        if(!sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedNameExpression))
            sysbvm_error("Local lambda analyzed name must be a literal node.");
        gcFrame.name = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);
    }

    // Count the actual argument count.
    size_t lambdaArgumentCount = 0;
    size_t argumentNodeCount = sysbvm_array_getSize(gcFrame.lambdaNode->arguments);
    for(size_t i = 0; i < argumentNodeCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at(gcFrame.lambdaNode->arguments, i);
        if(!sysbvm_astArgumentNode_isForAll(gcFrame.argumentNode))
            ++lambdaArgumentCount;
    }

    gcFrame.argumentCount = sysbvm_tuple_size_encode(context, lambdaArgumentCount);
    gcFrame.functionDefinition = (sysbvm_functionDefinition_t *)sysbvm_functionDefinition_create(context,
        gcFrame.lambdaNode->super.sourcePosition, gcFrame.lambdaNode->flags, gcFrame.lambdaNode->callingConventionName,
        gcFrame.argumentCount, *environment,
        gcFrame.lambdaNode->arguments, gcFrame.lambdaNode->resultType, gcFrame.lambdaNode->body
    );
    gcFrame.lambdaNode->functionDefinition = (sysbvm_tuple_t)gcFrame.functionDefinition;

    // Register the inner function.
    sysbvm_analysisEnvironment_addInnerFunction(context, *environment, (sysbvm_tuple_t)gcFrame.functionDefinition);

    // Perform the lambda analysis.
    sysbvm_functionDefinition_ensureAnalysis(context, &gcFrame.functionDefinition);

    gcFrame.lambdaNode->super.analyzedType = gcFrame.functionDefinition->type;
    if(gcFrame.functionDefinition->bytecode)
    {
        gcFrame.captureList = ((sysbvm_functionBytecode_t*)gcFrame.functionDefinition->bytecode)->captures;
    }
    else
    {
        SYSBVM_ASSERT(gcFrame.functionDefinition->sourceAnalyzedDefinition);
        gcFrame.captureList = ((sysbvm_functionSourceAnalyzedDefinition_t*)gcFrame.functionDefinition->sourceAnalyzedDefinition)->captures;
    }

    // Optimize lambdas without captures by turning them onto a literal.
    if(sysbvm_array_getSize(gcFrame.captureList) == 0)
    {
        gcFrame.capturelessFunction = sysbvm_function_createClosureWithCaptureVector(context, (sysbvm_tuple_t)gcFrame.functionDefinition, sysbvm_sequenceTuple_create(context, gcFrame.functionDefinition->captureVectorType));
        gcFrame.capturelessLiteral = sysbvm_astLiteralNode_create(context, gcFrame.lambdaNode->super.sourcePosition, gcFrame.capturelessFunction);
        if(gcFrame.name)
            gcFrame.localBinding = sysbvm_analysisEnvironment_setNewValueBinding(context, *environment, gcFrame.lambdaNode->super.sourcePosition, gcFrame.name, gcFrame.capturelessFunction);

        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.capturelessLiteral;
    }

    if(gcFrame.name)
    {
        gcFrame.localBinding = sysbvm_analysisEnvironment_setNewSymbolLocalBinding(context, *environment, gcFrame.lambdaNode->super.sourcePosition, gcFrame.name, gcFrame.lambdaNode->super.analyzedType);
        gcFrame.lambdaNode->binding = gcFrame.localBinding;
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.lambdaNode;
}